

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

leb_SameDepthNeighborIDs leb__SplitNodeIDs(leb_SameDepthNeighborIDs nodeIDs,uint32_t splitBit)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t n4;
  uint32_t uVar6;
  leb_SameDepthNeighborIDs lVar7;
  
  uVar5 = nodeIDs._0_8_;
  uVar6 = nodeIDs._reserved;
  uVar1 = nodeIDs.edge;
  if (splitBit == 0) {
    uVar3 = uVar6 * 2;
    iVar2 = uVar6 * 2 + 1;
    iVar4 = (uint)(uVar1 != 0) + uVar1 * 2;
    uVar5 = (ulong)((uint)(uVar5 >> 0x1f) & 0xfffffffe) | (ulong)(uVar5 >> 0x20 != 0);
  }
  else {
    iVar2 = uVar1 * 2;
    uVar5 = uVar5 * 2;
    iVar4 = uVar6 * 2;
    uVar3 = uVar6 * 2 + 1;
  }
  lVar7.right = iVar4;
  lVar7.left = iVar2;
  lVar7._8_8_ = uVar5 & 0xffffffff | (ulong)uVar3 << 0x20;
  return lVar7;
}

Assistant:

static leb_SameDepthNeighborIDs
leb__SplitNodeIDs(
    const leb_SameDepthNeighborIDs nodeIDs,
    const uint32_t splitBit
) {
    uint32_t n1 = nodeIDs.left, n2 = nodeIDs.right,
             n3 = nodeIDs.edge, n4 = nodeIDs._reserved;
    uint32_t b2 = (n2 == 0u) ? 0u : 1u,
             b3 = (n3 == 0u) ? 0u : 1u;

    if (splitBit == 0u) {
        return {n4 << 1 | 1, n3 << 1 | b3, n2 << 1 | b2, n4 << 1    };
    } else {
        return {n3 << 1    , n4 << 1     , n1 << 1     , n4 << 1 | 1};
    }
}